

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void ConnCloseHandler(CManager cm,CMConnection conn,void *client_data)

{
  mapped_type pAVar1;
  bool bVar2;
  mapped_type *ppAVar3;
  ostream *poVar4;
  mapped_type *ppAVar5;
  AnonSimpleFile *sfile;
  AnonADIOSFile *file;
  _Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> it1;
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>,_std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>_>
  it;
  mapped_type in_stack_fffffffffffffee8;
  ostream *in_stack_fffffffffffffef0;
  AnonADIOSFile *in_stack_ffffffffffffff10;
  undefined1 local_98 [56];
  string local_60 [32];
  mapped_type local_40;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> local_38 [2];
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>,_std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>_>
  local_28;
  
  local_28 = std::
             unordered_multimap<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::equal_range((unordered_multimap<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                            *)in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->m_io);
  local_38[0] = local_28.first.
                super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur;
  while (bVar2 = std::__detail::operator!=
                           (local_38,&local_28.second.
                                      super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>
                           ), bVar2) {
    std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator->
              ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)0x119442);
    ppAVar3 = std::
              unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
              ::operator[]((unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
                            *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
    local_40 = *ppAVar3;
    if (local_40 != (mapped_type)0x0) {
      if (0 < verbose) {
        poVar4 = std::operator<<((ostream *)&std::cout,"closing ADIOS file \"");
        poVar4 = std::operator<<(poVar4,(string *)&local_40->m_FileName);
        poVar4 = std::operator<<(poVar4,"\" total sent ");
        readable_size_abi_cxx11_((uint64_t)conn);
        poVar4 = std::operator<<(poVar4,local_60);
        poVar4 = std::operator<<(poVar4," in ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40->m_OperationCount);
        poVar4 = std::operator<<(poVar4," Get()s");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_60);
      }
      std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator->
                ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)0x11958d);
      std::
      unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
      ::erase((unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
               *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
      pAVar1 = local_40;
      if (local_40 != (mapped_type)0x0) {
        AnonADIOSFile::~AnonADIOSFile(in_stack_ffffffffffffff10);
        operator_delete(pAVar1);
      }
    }
    std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator->
              ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)0x1195d6);
    ppAVar5 = std::
              unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
              ::operator[]((unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
                            *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
    local_98._32_8_ = *ppAVar5;
    if ((mapped_type)local_98._32_8_ != (mapped_type)0x0) {
      if (0 < verbose) {
        poVar4 = std::operator<<((ostream *)&std::cout,"closing simple file ");
        poVar4 = std::operator<<(poVar4,(string *)(local_98._32_8_ + 0x20));
        poVar4 = std::operator<<(poVar4,"\" total sent ");
        in_stack_ffffffffffffff10 = (AnonADIOSFile *)local_98;
        readable_size_abi_cxx11_((uint64_t)conn);
        poVar4 = std::operator<<(poVar4,(string *)in_stack_ffffffffffffff10);
        poVar4 = std::operator<<(poVar4," in ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(size_t *)(local_98._32_8_ + 0x48));
        in_stack_fffffffffffffef0 = std::operator<<(poVar4," Read()s");
        std::ostream::operator<<(in_stack_fffffffffffffef0,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_98);
      }
      std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator->
                ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)0x119721);
      std::
      unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
      ::erase((unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
               *)in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
      in_stack_fffffffffffffee8 = local_40;
      if (local_40 != (mapped_type)0x0) {
        AnonADIOSFile::~AnonADIOSFile(in_stack_ffffffffffffff10);
        operator_delete(in_stack_fffffffffffffee8);
      }
    }
    std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::operator++
              ((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)
               in_stack_fffffffffffffee8,0);
  }
  std::
  unordered_multimap<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::erase((unordered_multimap<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           *)in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->m_io);
  return;
}

Assistant:

static void ConnCloseHandler(CManager cm, CMConnection conn, void *client_data)
{
    auto it = ConnToFileMap.equal_range(conn);
    for (auto it1 = it.first; it1 != it.second; it1++)
    {
        AnonADIOSFile *file = ADIOSFileMap[it1->second];
        if (file)
        {
            if (verbose >= 1)
                std::cout << "closing ADIOS file \"" << file->m_FileName << "\" total sent "
                          << readable_size(file->m_BytesSent) << " in " << file->m_OperationCount
                          << " Get()s" << std::endl;
            ADIOSFileMap.erase(it1->second);
            delete file;
        }
        AnonSimpleFile *sfile = SimpleFileMap[it1->second];
        if (sfile)
        {
            if (verbose >= 1)
                std::cout << "closing simple file " << sfile->m_FileName << "\" total sent "
                          << readable_size(sfile->m_BytesSent) << " in " << sfile->m_OperationCount
                          << " Read()s" << std::endl;
            SimpleFileMap.erase(it1->second);
            delete file;
        }
    }
    ConnToFileMap.erase(conn);
}